

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O0

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  ssize_t sVar5;
  undefined1 *in_RCX;
  int in_EDX;
  archive_entry *in_RSI;
  archive_entry *in_RDI;
  int lnklen;
  char *linkbuffer;
  size_t linkbuffer_len;
  int r1;
  int r;
  int initial_fd;
  stat s;
  char *name;
  char *path;
  archive_read_disk *a;
  int *in_stack_00000f28;
  archive_entry *in_stack_00000f30;
  archive_read_disk *in_stack_00000f38;
  archive_entry *in_stack_fffffffffffffed8;
  archive_entry *in_stack_fffffffffffffee0;
  archive_entry *paVar6;
  int local_f4;
  int *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 local_d0 [112];
  char *local_38;
  undefined1 *local_28;
  int local_1c;
  archive_entry *local_18;
  archive_entry *local_10;
  int local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  archive_clear_error((archive *)in_RDI);
  local_38 = archive_entry_sourcepath(in_stack_fffffffffffffed8);
  if (local_38 == (char *)0x0) {
    local_38 = archive_entry_pathname(in_stack_fffffffffffffed8);
  }
  local_28 = in_RCX;
  if ((in_RDI->ae_stat).aest_uid == 0) {
    if (in_RCX == (undefined1 *)0x0) {
      if (local_1c < 0) {
        if (*(char *)((long)&(in_RDI->ae_stat).aest_size + 1) == '\0') {
          iVar1 = lstat(local_38,(stat *)local_d0);
          if (iVar1 != 0) {
            puVar3 = (uint *)__errno_location();
            archive_set_error((archive *)in_RDI,(int)(ulong)*puVar3,"Can\'t lstat %s",local_38);
            return -0x19;
          }
        }
        else {
          iVar1 = stat(local_38,(stat *)local_d0);
          if (iVar1 != 0) {
            puVar3 = (uint *)__errno_location();
            archive_set_error((archive *)in_RDI,(int)(ulong)*puVar3,"Can\'t stat %s",local_38);
            return -0x19;
          }
        }
      }
      else {
        iVar1 = fstat(local_1c,(stat *)local_d0);
        if (iVar1 != 0) {
          puVar3 = (uint *)__errno_location();
          archive_set_error((archive *)in_RDI,(int)(ulong)*puVar3,"Can\'t fstat");
          return -0x19;
        }
      }
      local_28 = local_d0;
    }
    archive_entry_copy_stat(in_stack_fffffffffffffee0,(stat *)in_stack_fffffffffffffed8);
  }
  paVar6 = local_10;
  archive_entry_uid(local_18);
  pcVar4 = archive_read_disk_uname((archive *)paVar6,(int64_t)in_stack_fffffffffffffee0);
  if (pcVar4 != (char *)0x0) {
    archive_entry_copy_uname(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
  }
  archive_entry_gid(local_18);
  pcVar4 = archive_read_disk_gname((archive *)paVar6,(int64_t)local_10);
  paVar6 = local_10;
  if (pcVar4 != (char *)0x0) {
    archive_entry_copy_gname(local_10,(char *)in_stack_fffffffffffffed8);
    paVar6 = local_10;
  }
  if ((*(uint *)(local_28 + 0x18) & 0xf000) == 0xa000) {
    in_stack_ffffffffffffff18 = (int *)(*(long *)(local_28 + 0x30) + 1);
    pcVar4 = (char *)malloc((size_t)in_stack_ffffffffffffff18);
    if (pcVar4 == (char *)0x0) {
      archive_set_error((archive *)in_RDI,0xc,"Couldn\'t read link data");
      return -0x19;
    }
    if ((in_RDI->ae_stat).aest_uid == 0) {
      sVar5 = readlink(local_38,pcVar4,(size_t)in_stack_ffffffffffffff18);
      local_f4 = (int)sVar5;
    }
    else {
      iVar1 = (*(code *)(in_RDI->ae_stat).aest_dev)((tree *)(in_RDI->ae_stat).aest_uid);
      sVar5 = readlinkat(iVar1,local_38,pcVar4,(size_t)in_stack_ffffffffffffff18);
      local_f4 = (int)sVar5;
    }
    if (local_f4 < 0) {
      puVar3 = (uint *)__errno_location();
      archive_set_error((archive *)in_RDI,(int)(ulong)*puVar3,"Couldn\'t read link data");
      free(pcVar4);
      return -0x19;
    }
    pcVar4[local_f4] = '\0';
    archive_entry_set_symlink(paVar6,(char *)in_stack_fffffffffffffed8);
    free(pcVar4);
  }
  iVar1 = setup_acls((archive_read_disk *)in_RDI,local_18,&local_1c);
  iVar2 = setup_xattrs((archive_read_disk *)CONCAT44(in_EDX,iVar1),
                       (archive_entry *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff18);
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
  if (((in_RDI->ae_stat).aest_rdev_is_broken_down != L'\0') &&
     (iVar2 = setup_mac_metadata((archive_read_disk *)in_RDI,local_18,&local_1c), iVar2 < iVar1)) {
    iVar1 = iVar2;
  }
  iVar2 = setup_sparse(in_stack_00000f38,in_stack_00000f30,in_stack_00000f28);
  local_4 = iVar1;
  if (iVar2 < iVar1) {
    local_4 = iVar2;
  }
  if (in_EDX != local_1c) {
    close(local_1c);
  }
  return local_4;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if (st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS)
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd, EXT2_IOC_GETFLAGS, &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = setup_acls(a, entry, &fd);
	r1 = setup_xattrs(a, entry, &fd);
	if (r1 < r)
		r = r1;
	if (a->enable_copyfile) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}